

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void do_dup(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t oprsz,uint32_t maxsz,
           TCGv_i32 in_32,TCGv_i64 in_64,uint64_t in_c)

{
  _Bool prefer_i64;
  TCGType_conflict type;
  uint32_t val;
  TCGv_vec arg2;
  TCGv_i32 ret;
  TCGv_ptr ret_00;
  TCGv_i64 pTVar1;
  uintptr_t o_2;
  uint uVar2;
  uintptr_t o;
  uintptr_t o_1;
  uint64_t local_48;
  
  if ((in_32 == (TCGv_i32)0x0) + 2 < vece) {
    __assert_fail("vece <= (in_32 ? MO_32 : MO_64)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x1e1,
                  "void do_dup(TCGContext *, unsigned int, uint32_t, uint32_t, uint32_t, TCGv_i32, TCGv_i64, uint64_t)"
                 );
  }
  if (in_64 != (TCGv_i64)0x0 && in_32 != (TCGv_i32)0x0) {
    __assert_fail("in_32 == NULL || in_64 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x1e2,
                  "void do_dup(TCGContext *, unsigned int, uint32_t, uint32_t, uint32_t, TCGv_i32, TCGv_i64, uint64_t)"
                 );
  }
  if (in_32 == (TCGv_i32)0x0 && in_64 == (TCGv_i64)0x0) {
    in_c = dup_const_func_tricore(vece,in_c);
    if (in_c == 0) {
      oprsz = maxsz;
    }
LAB_00b5c13d:
    prefer_i64 = vece == 3 || in_64 == (TCGv_i64)0x0;
    local_48 = in_c;
  }
  else {
    if (in_32 == (TCGv_i32)0x0) goto LAB_00b5c13d;
    local_48 = in_c;
    prefer_i64 = false;
  }
  type = choose_vector_type(tcg_ctx,(TCGOpcode *)0x0,vece,oprsz,prefer_i64);
  if (type != TCG_TYPE_I32) {
    arg2 = tcg_temp_new_vec_tricore(tcg_ctx,type);
    if (in_32 == (TCGv_i32)0x0) {
      if (in_64 == (TCGv_i64)0x0) {
        tcg_gen_dupi_vec_tricore(tcg_ctx,vece,arg2,local_48);
      }
      else {
        tcg_gen_dup_i64_vec_tricore(tcg_ctx,vece,arg2,in_64);
      }
    }
    else {
      tcg_gen_dup_i32_vec_tricore(tcg_ctx,vece,arg2,in_32);
    }
    do_dup_store(tcg_ctx,type,dofs,oprsz,maxsz,arg2);
    goto LAB_00b5c4e3;
  }
  uVar2 = (uint)local_48;
  if (oprsz - 8 < 0x20 && (oprsz & 7) == 0) {
    if (in_32 == (TCGv_i32)0x0) {
      if (in_64 != (TCGv_i64)0x0) {
        ret = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
        pTVar1 = in_64;
        goto LAB_00b5c2ce;
      }
      if (((oprsz < 0x14) && (vece != 3)) && (local_48 - 1 < 0xfffffffffffffffe)) {
        ret = tcg_const_i32_tricore(tcg_ctx,uVar2);
        goto LAB_00b5c1f9;
      }
      ret = (TCGv_i32)tcg_const_i64_tricore(tcg_ctx,local_48);
    }
    else {
      if ((vece == 2) && (oprsz < 0x14)) {
        ret = tcg_temp_new_i32(tcg_ctx);
        gen_dup_i32(tcg_ctx,2,ret,in_32);
LAB_00b5c1f9:
        if (ret != (TCGv_i32)0x0) {
          for (uVar2 = 0; uVar2 < oprsz; uVar2 = uVar2 + 4) {
            tcg_gen_st_i32(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(dofs + uVar2));
          }
          goto LAB_00b5c39c;
        }
        goto LAB_00b5c303;
      }
      ret = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      tcg_gen_extu_i32_i64_tricore(tcg_ctx,(TCGv_i64)ret,in_32);
      pTVar1 = (TCGv_i64)ret;
LAB_00b5c2ce:
      gen_dup_i64(tcg_ctx,vece,(TCGv_i64)ret,pTVar1);
    }
    if (ret != (TCGv_i32)0x0) {
      for (uVar2 = 0; uVar2 < oprsz; uVar2 = uVar2 + 8) {
        tcg_gen_st_i64_tricore(tcg_ctx,(TCGv_i64)ret,tcg_ctx->cpu_env,(ulong)(dofs + uVar2));
      }
LAB_00b5c39c:
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      if (maxsz < oprsz || maxsz - oprsz == 0) {
        return;
      }
      expand_clr(tcg_ctx,oprsz + dofs,maxsz - oprsz);
      return;
    }
  }
LAB_00b5c303:
  ret_00 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_tricore(tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(ulong)dofs);
  val = simd_desc_tricore(oprsz,maxsz,0);
  arg2 = (TCGv_vec)tcg_const_i32_tricore(tcg_ctx,val);
  if (vece == 3) {
    if (in_64 == (TCGv_i64)0x0) {
      pTVar1 = tcg_const_i64_tricore(tcg_ctx,local_48);
      gen_helper_gvec_dup64(tcg_ctx,ret_00,(TCGv_i32)arg2,pTVar1);
LAB_00b5c4c7:
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    }
    else {
      gen_helper_gvec_dup64(tcg_ctx,ret_00,(TCGv_i32)arg2,in_64);
    }
  }
  else {
    if (in_32 == (TCGv_i32)0x0) {
      pTVar1 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      if (in_64 == (TCGv_i64)0x0) {
        if (vece == 1) {
          tcg_gen_movi_i32(tcg_ctx,(TCGv_i32)pTVar1,(uint)(ushort)local_48);
        }
        else {
          if (vece == 0) {
            uVar2 = (uint)(byte)local_48;
          }
          tcg_gen_movi_i32(tcg_ctx,(TCGv_i32)pTVar1,uVar2);
        }
      }
      else {
        tcg_gen_extrl_i64_i32_tricore(tcg_ctx,(TCGv_i32)pTVar1,in_64);
      }
      (*do_dup::fns[vece])(tcg_ctx,ret_00,(TCGv_i32)arg2,(TCGv_i32)pTVar1);
      goto LAB_00b5c4c7;
    }
    (*do_dup::fns[vece])(tcg_ctx,ret_00,(TCGv_i32)arg2,in_32);
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
LAB_00b5c4e3:
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_dup(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t oprsz,
                   uint32_t maxsz, TCGv_i32 in_32, TCGv_i64 in_64,
                   uint64_t in_c)
{
    TCGType type;
    TCGv_i64 t_64;
    TCGv_i32 t_32, t_desc;
    TCGv_ptr t_ptr;
    uint32_t i;

    assert(vece <= (in_32 ? MO_32 : MO_64));
    assert(in_32 == NULL || in_64 == NULL);

    /* If we're storing 0, expand oprsz to maxsz.  */
    if (in_32 == NULL && in_64 == NULL) {
        in_c = dup_const(vece, in_c);
        if (in_c == 0) {
            oprsz = maxsz;
        }
    }

    /* Implement inline with a vector type, if possible.
     * Prefer integer when 64-bit host and no variable dup.
     */
    type = choose_vector_type(tcg_ctx, NULL, vece, oprsz,
                              (TCG_TARGET_REG_BITS == 64 && in_32 == NULL
                               && (in_64 == NULL || vece == MO_64)));
    if (type != 0) {
        TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);

        if (in_32) {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, t_vec, in_32);
        } else if (in_64) {
            tcg_gen_dup_i64_vec(tcg_ctx, vece, t_vec, in_64);
        } else {
            tcg_gen_dupi_vec(tcg_ctx, vece, t_vec, in_c);
        }
        do_dup_store(tcg_ctx, type, dofs, oprsz, maxsz, t_vec);
        tcg_temp_free_vec(tcg_ctx, t_vec);
        return;
    }

    /* Otherwise, inline with an integer type, unless "large".  */
    if (check_size_impl(oprsz, TCG_TARGET_REG_BITS / 8)) {
        t_64 = NULL;
        t_32 = NULL;

        if (in_32) {
            /* We are given a 32-bit variable input.  For a 64-bit host,
               use a 64-bit operation unless the 32-bit operation would
               be simple enough.  */
            if (TCG_TARGET_REG_BITS == 64
                && (vece != MO_32 || !check_size_impl(oprsz, 4))) {
                t_64 = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_extu_i32_i64(tcg_ctx, t_64, in_32);
                gen_dup_i64(tcg_ctx, vece, t_64, t_64);
            } else {
                t_32 = tcg_temp_new_i32(tcg_ctx);
                gen_dup_i32(tcg_ctx, vece, t_32, in_32);
            }
        } else if (in_64) {
            /* We are given a 64-bit variable input.  */
            t_64 = tcg_temp_new_i64(tcg_ctx);
            gen_dup_i64(tcg_ctx, vece, t_64, in_64);
        } else {
            /* We are given a constant input.  */
            /* For 64-bit hosts, use 64-bit constants for "simple" constants
               or when we'd need too many 32-bit stores, or when a 64-bit
               constant is really required.  */
            if (vece == MO_64
                || (TCG_TARGET_REG_BITS == 64
                    && (in_c == 0 || in_c == -1
                        || !check_size_impl(oprsz, 4)))) {
                t_64 = tcg_const_i64(tcg_ctx, in_c);
            } else {
                t_32 = tcg_const_i32(tcg_ctx, in_c);
            }
        }

        /* Implement inline if we picked an implementation size above.  */
        if (t_32) {
            for (i = 0; i < oprsz; i += 4) {
                tcg_gen_st_i32(tcg_ctx, t_32, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_i32(tcg_ctx, t_32);
            goto done;
        }
        if (t_64) {
            for (i = 0; i < oprsz; i += 8) {
                tcg_gen_st_i64(tcg_ctx, t_64, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_i64(tcg_ctx, t_64);
            goto done;
        }
    }

    /* Otherwise implement out of line.  */
    t_ptr = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, t_ptr, tcg_ctx->cpu_env, dofs);
    t_desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, 0));

    if (vece == MO_64) {
        if (in_64) {
            gen_helper_gvec_dup64(tcg_ctx, t_ptr, t_desc, in_64);
        } else {
            t_64 = tcg_const_i64(tcg_ctx, in_c);
            gen_helper_gvec_dup64(tcg_ctx, t_ptr, t_desc, t_64);
            tcg_temp_free_i64(tcg_ctx, t_64);
        }
    } else {
        typedef void dup_fn(TCGContext *, TCGv_ptr, TCGv_i32, TCGv_i32);
        static dup_fn * const fns[3] = {
            gen_helper_gvec_dup8,
            gen_helper_gvec_dup16,
            gen_helper_gvec_dup32
        };

        if (in_32) {
            fns[vece](tcg_ctx, t_ptr, t_desc, in_32);
        } else {
            t_32 = tcg_temp_new_i32(tcg_ctx);
            if (in_64) {
                tcg_gen_extrl_i64_i32(tcg_ctx, t_32, in_64);
            } else if (vece == MO_8) {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c & 0xff);
            } else if (vece == MO_16) {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c & 0xffff);
            } else {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c);
            }
            fns[vece](tcg_ctx, t_ptr, t_desc, t_32);
            tcg_temp_free_i32(tcg_ctx, t_32);
        }
    }

    tcg_temp_free_ptr(tcg_ctx, t_ptr);
    tcg_temp_free_i32(tcg_ctx, t_desc);
    return;

 done:
    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}